

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::AttributeRecordSet::Encode(AttributeRecordSet *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *this_00;
  reference this_01;
  StandardVariable *pSVar2;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  AttributeRecordSet *this_local;
  
  this_00 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_EntityID);
  KDataStream::operator<<(this_00,this->m_ui16NumAttrRecs);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
            ::begin(&this->m_vAttrRec);
  local_28._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
       ::end(&this->m_vAttrRec);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
              ::operator*(&citrEnd);
    pSVar2 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator->(this_01);
    (*(pSVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pSVar2,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void AttributeRecordSet::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_EntityID
           << m_ui16NumAttrRecs;

    vector<StdVarPtr>::const_iterator citr = m_vAttrRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vAttrRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }
}